

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::checkForgotSubst(CheckerVisitor *this,LiteralExpr *l)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  _func_int **pp_Var6;
  LiteralExpr *pLVar7;
  pointer pSVar8;
  Node *pNVar9;
  
  if ((this->effectsOnly == false) && (l->_kind == LK_STRING)) {
    for (pSVar8 = (this->nodeStack).
                  super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pSVar8 != (this->nodeStack).
                  super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar8 = pSVar8 + -1) {
      if ((pSVar8[-1].sst == SST_NODE) && (pNVar9 = pSVar8[-1].field_1.n, pNVar9->_op == TO_CALL))
      goto LAB_0014fa3c;
    }
    pNVar9 = (Node *)0x0;
LAB_0014fa3c:
    pcVar5 = (l->_v).s;
    pcVar3 = strchr(pcVar5,0x7b);
    if (pcVar3 == (char *)0x0) {
      return;
    }
    cVar1 = pcVar3[1];
    iVar2 = isalpha((int)cVar1);
    if ((cVar1 != 0x5f) && (iVar2 == 0)) {
      return;
    }
    pcVar4 = strstr(pcVar5,":i=");
    if (pcVar4 != (char *)0x0) {
      return;
    }
    pcVar4 = strstr(pcVar5,":r=");
    if (pcVar4 != (char *)0x0) {
      return;
    }
    pcVar4 = strstr(pcVar5,":t=");
    if (pcVar4 != (char *)0x0) {
      return;
    }
    pcVar4 = strstr(pcVar5,":p2=");
    if (pcVar4 != (char *)0x0) {
      return;
    }
    pcVar4 = strstr(pcVar5,":p3=");
    if (pcVar4 != (char *)0x0) {
      return;
    }
    pcVar5 = strstr(pcVar5,":tm=");
    if (cVar1 == '\0') {
      return;
    }
    if (pcVar5 != (char *)0x0) {
      return;
    }
    pcVar5 = strchr(pcVar3 + 2,0x7d);
    if (pcVar5 == (char *)0x0) {
      return;
    }
    if (pNVar9 == (Node *)0x0) goto LAB_0014fbec;
    for (pp_Var6 = pNVar9[1].super_ArenaObj._vptr_ArenaObj; pp_Var6 != (_func_int **)0x0;
        pp_Var6 = (_func_int **)pp_Var6[4]) {
      if (*(int *)(pp_Var6 + 3) != 0x37) goto LAB_0014fb38;
    }
    pp_Var6 = (_func_int **)0x0;
LAB_0014fb38:
    if (*(int *)(pp_Var6 + 3) == 0x11) {
      iVar2 = strcmp("loc",(char *)pp_Var6[4]);
      if ((iVar2 != 0) || (pNVar9[1]._op < TO_WHILE)) goto LAB_0014fbec;
      for (pLVar7 = *(LiteralExpr **)(*(long *)&pNVar9[1]._coordinates.lineEnd + 8);
          pLVar7 != (LiteralExpr *)0x0; pLVar7 = (LiteralExpr *)(pLVar7->_v).i) {
        if (*(int *)&pLVar7->field_0x18 != 0x37) goto LAB_0014fbe3;
      }
    }
    else {
      if (*(int *)(pp_Var6 + 3) != 0x3f) goto LAB_0014fbec;
      for (pLVar7 = (LiteralExpr *)pp_Var6[4]; pLVar7 != (LiteralExpr *)0x0;
          pLVar7 = (LiteralExpr *)(pLVar7->_v).i) {
        if (*(int *)&pLVar7->field_0x18 != 0x37) goto LAB_0014fb94;
      }
      pLVar7 = (LiteralExpr *)0x0;
LAB_0014fb94:
      if (pLVar7 == l) {
        iVar2 = strcmp((char *)pp_Var6[6],"subst");
        if (iVar2 == 0) {
          return;
        }
        goto LAB_0014fbec;
      }
      iVar2 = strcmp((char *)pp_Var6[6],"split");
      if ((iVar2 != 0) || (pNVar9[1]._op == TO_BLOCK)) goto LAB_0014fbec;
      for (pLVar7 = (LiteralExpr *)**(long **)&pNVar9[1]._coordinates.lineEnd;
          pLVar7 != (LiteralExpr *)0x0; pLVar7 = (LiteralExpr *)(pLVar7->_v).i) {
        if (*(int *)&pLVar7->field_0x18 != 0x37) goto LAB_0014fbe3;
      }
    }
    pLVar7 = (LiteralExpr *)0x0;
LAB_0014fbe3:
    if (pLVar7 != l) {
LAB_0014fbec:
      report(this,(Node *)l,0x6f);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkForgotSubst(const LiteralExpr *l) {
  if (effectsOnly)
    return;

  if (l->kind() != LK_STRING)
    return;

  const CallExpr *candidate = nullptr;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;

    if (n->op() == TO_CALL) {
      candidate = static_cast<const CallExpr *>(n);
      break;
    }
  }

  const SQChar *s = l->s();
  if (!stringLooksLikeFormatTemplate(s)) {
    return;
  }

  bool ok = false;

  if (candidate) {
    const Expr *callee = deparen(candidate->callee());
    const auto &arguments = candidate->arguments();
    if (callee->op() == TO_GETFIELD) { // -V522
      const GetFieldExpr *f = callee->asGetField();
      const SQChar *funcName = f->fieldName();
      if (deparen(f->receiver()) == l) {
        ok = strcmp(funcName, "subst") == 0;
      } else if (strcmp(funcName, "split") == 0) {
        ok = arguments.size() >= 1 && deparen(arguments[0]) == l;;
      }
    }
    else if (callee->op() == TO_ID) { // -V522
      if (strcmp("loc", callee->asId()->id()) == 0) {
        ok = arguments.size() >= 2 && deparen(arguments[1]) == l;
      }
    }
  }

  if (!ok)
    report(l, DiagnosticsId::DI_FORGOT_SUBST);
}